

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O1

void __thiscall
tchecker::parsing::process_declaration_t::process_declaration_t
          (process_declaration_t *this,string *name,attributes_t *attr,string *context)

{
  pointer pcVar1;
  invalid_argument *this_00;
  
  declaration_t::declaration_t((declaration_t *)this,attr,context);
  (this->super_inner_declaration_t).super_declaration_t._vptr_declaration_t =
       (_func_int **)&PTR__process_declaration_t_00125510;
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_name,pcVar1,pcVar1 + name->_M_string_length);
  if ((this->_name)._M_string_length != 0) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"process declaration has empty name");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

process_declaration_t::process_declaration_t(std::string const & name, tchecker::parsing::attributes_t const & attr,
                                             std::string const & context)
    : tchecker::parsing::inner_declaration_t(attr, context), _name(name)
{
  if (_name.empty())
    throw std::invalid_argument("process declaration has empty name");
}